

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O1

void __thiscall
tchecker::syncprod::vloc_synchronized_edges_iterator_t::vloc_synchronized_edges_iterator_t
          (vloc_synchronized_edges_iterator_t *this,
          intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
          *vloc,shared_ptr<const_tchecker::system::loc_edges_maps_t> *loc_edges_maps,
          const_iterator_t *sync_begin,const_iterator_t *sync_end)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->_vloc)._t = (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
  reset(&this->_vloc,vloc->_t);
  (this->_loc_edges_maps).
  super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (loc_edges_maps->
       super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  p_Var1 = (loc_edges_maps->
           super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
  (this->_loc_edges_maps).
  super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_sync_it)._M_current = sync_begin->_M_current;
  (this->_sync_end)._M_current = sync_end->_M_current;
  (this->_cartesian_it)._nranges = 0;
  (this->_cartesian_it)._begins.
  super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_cartesian_it)._begins.
  super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_cartesian_it)._begins.
  super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_cartesian_it)._ends.
  super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_cartesian_it)._ends.
  super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_cartesian_it)._ends.
  super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_cartesian_it)._its.
  super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_cartesian_it)._its.
  super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_cartesian_it)._its.
  super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  advance_while_empty_cartesian_product(this);
  return;
}

Assistant:

vloc_synchronized_edges_iterator_t::vloc_synchronized_edges_iterator_t(
    tchecker::intrusive_shared_ptr_t<tchecker::shared_vloc_t const> const & vloc,
    std::shared_ptr<tchecker::system::loc_edges_maps_t const> const & loc_edges_maps,
    tchecker::system::synchronizations_t::const_iterator_t const & sync_begin,
    tchecker::system::synchronizations_t::const_iterator_t const & sync_end)
    : _vloc(vloc), _loc_edges_maps(loc_edges_maps), _sync_it(sync_begin), _sync_end(sync_end)
{
  advance_while_empty_cartesian_product();
}